

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__set_reuse(int fd)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  int yes;
  undefined4 local_c [2];
  int local_4;
  
  local_c[0] = 1;
  iVar1 = setsockopt(in_EDI,1,2,local_c,4);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    piVar2 = __errno_location();
    local_4 = -*piVar2;
  }
  return local_4;
}

Assistant:

static int uv__set_reuse(int fd) {
  int yes;

#if defined(SO_REUSEPORT) && !defined(__linux__)
  yes = 1;
  if (setsockopt(fd, SOL_SOCKET, SO_REUSEPORT, &yes, sizeof(yes)))
    return -errno;
#else
  yes = 1;
  if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof(yes)))
    return -errno;
#endif

  return 0;
}